

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.cpp
# Opt level: O2

void __thiscall btSimpleBroadphase::validate(btSimpleBroadphase *this)

{
  return;
}

Assistant:

void	btSimpleBroadphase::validate()
{
	for (int i=0;i<m_numHandles;i++)
	{
		for (int j=i+1;j<m_numHandles;j++)
		{
			btAssert(&m_pHandles[i] != &m_pHandles[j]);
		}
	}
	
}